

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_search_localfile
              (char **searchpaths,int cwd,char *name,char *revision,char **localfile,
              LYS_INFORMAT *format)

{
  long lVar1;
  char *pcVar2;
  char **__s1;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  dirent *pdVar6;
  size_t __n;
  undefined1 local_140 [8];
  stat st;
  ly_set *dirs;
  uint local_a0;
  uint u;
  LYS_INFORMAT match_format;
  LYS_INFORMAT format_aux;
  char *match_name;
  dirent *file;
  DIR *dir;
  char *wn;
  char *wd;
  int local_68;
  int ret;
  int implicit_cwd;
  int i;
  size_t dir_len;
  size_t match_len;
  size_t flen;
  size_t len;
  LYS_INFORMAT *format_local;
  char **localfile_local;
  char *revision_local;
  char *name_local;
  char **ppcStack_18;
  int cwd_local;
  char **searchpaths_local;
  
  dir_len = 0;
  local_68 = 0;
  wd._4_4_ = 1;
  dir = (DIR *)0x0;
  file = (dirent *)0x0;
  _match_format = (DIR *)0x0;
  local_a0 = 0;
  len = (size_t)format;
  format_local = (LYS_INFORMAT *)localfile;
  localfile_local = (char **)revision;
  revision_local = name;
  name_local._4_4_ = cwd;
  ppcStack_18 = searchpaths;
  if (localfile == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_search_localfile");
    return 1;
  }
  st.__glibc_reserved[2] = (__syscall_slong_t)ly_set_new();
  if ((ly_set *)st.__glibc_reserved[2] == (ly_set *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_search_localfile")
    ;
    return 1;
  }
  flen = strlen(revision_local);
  if (name_local._4_4_ != 0) {
    wn = get_current_dir_name();
    if (wn == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_search_localfile");
      goto LAB_0018c5c1;
    }
    iVar3 = ly_set_add((ly_set *)st.__glibc_reserved[2],wn,0);
    if (iVar3 == -1) goto LAB_0018c5c1;
    local_68 = 1;
  }
  if (ppcStack_18 != (char **)0x0) {
    for (ret = 0; ppcStack_18[ret] != (char *)0x0; ret = ret + 1) {
      if ((local_68 == 0) ||
         (iVar3 = strcmp((char *)**(undefined8 **)(st.__glibc_reserved[2] + 8),ppcStack_18[ret]),
         iVar3 != 0)) {
        wn = strdup(ppcStack_18[ret]);
        if (wn == (char *)0x0) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_search_localfile");
          goto LAB_0018c5c1;
        }
        iVar3 = ly_set_add((ly_set *)st.__glibc_reserved[2],wn,0);
        if (iVar3 == -1) goto LAB_0018c5c1;
      }
      else {
        local_68 = 0;
      }
    }
  }
  wn = (char *)0x0;
  while (*(int *)(st.__glibc_reserved[2] + 4) != 0) {
    free(wn);
    free(dir);
    dir = (DIR *)0x0;
    *(int *)(st.__glibc_reserved[2] + 4) = *(int *)(st.__glibc_reserved[2] + 4) + -1;
    wn = *(char **)(*(long *)(st.__glibc_reserved[2] + 8) +
                   (ulong)*(uint *)(st.__glibc_reserved[2] + 4) * 8);
    *(undefined8 *)
     (*(long *)(st.__glibc_reserved[2] + 8) + (ulong)*(uint *)(st.__glibc_reserved[2] + 4) * 8) = 0;
    ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Searching for \"%s\" in %s.",revision_local,wn);
    if (file != (dirent *)0x0) {
      closedir((DIR *)file);
    }
    file = (dirent *)opendir(wn);
    _implicit_cwd = strlen(wn);
    pcVar2 = wn;
    if (file == (dirent *)0x0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
             "Unable to open directory \"%s\" for searching (sub)modules (%s).",pcVar2,pcVar5);
    }
    else {
LAB_0018c168:
      pdVar6 = readdir((DIR *)file);
      if (pdVar6 != (dirent *)0x0) {
        iVar3 = strcmp(".",pdVar6->d_name);
        if ((iVar3 != 0) && (iVar3 = strcmp("..",pdVar6->d_name), iVar3 != 0)) {
          free(dir);
          iVar3 = asprintf((char **)&dir,"%s/%s",wn);
          if (iVar3 == -1) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_search_localfile");
            goto LAB_0018c5c1;
          }
          iVar3 = stat((char *)dir,(stat *)local_140);
          pcVar2 = wn;
          if (iVar3 == -1) {
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
                   "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
                   ,pdVar6->d_name,pcVar2,pcVar5);
          }
          else {
            if ((((uint)st.st_nlink & 0xf000) == 0x4000) &&
               ((*(int *)(st.__glibc_reserved[2] + 4) != 0 || (local_68 == 0)))) {
              iVar3 = ly_set_add((ly_set *)st.__glibc_reserved[2],dir,0);
              if (iVar3 == -1) goto LAB_0018c5c1;
              dir = (DIR *)0x0;
              goto LAB_0018c168;
            }
            if ((((uint)st.st_nlink & 0xf000) == 0x8000) &&
               ((iVar3 = strncmp(revision_local,pdVar6->d_name,flen), iVar3 == 0 &&
                ((pdVar6->d_name[flen] == '.' || (pdVar6->d_name[flen] == '@')))))) {
              match_len = strlen(pdVar6->d_name);
              iVar3 = strcmp(pdVar6->d_name + (match_len - 4),".yin");
              if (iVar3 == 0) {
                u = 2;
              }
              else {
                iVar3 = strcmp(pdVar6->d_name + (match_len - 5),".yang");
                if (iVar3 != 0) goto LAB_0018c168;
                u = 1;
              }
              __s1 = localfile_local;
              if (localfile_local != (char **)0x0) {
                if (pdVar6->d_name[flen] == '@') {
                  lVar1 = flen + 1;
                  __n = strlen((char *)localfile_local);
                  iVar3 = strncmp((char *)__s1,pdVar6->d_name + lVar1,__n);
                  if (iVar3 == 0) {
                    free(_match_format);
                    _match_format = dir;
                    dir = (DIR *)0x0;
                    dir_len = _implicit_cwd + 1 + flen;
                    local_a0 = u;
                    break;
                  }
                }
                else {
                  free(_match_format);
                  _match_format = dir;
                  dir = (DIR *)0x0;
                  dir_len = _implicit_cwd + 1 + flen;
                  local_a0 = u;
                }
                goto LAB_0018c168;
              }
              if (_match_format != (DIR *)0x0) {
                if (((pdVar6->d_name[flen] != '@') ||
                    (iVar3 = lyp_check_date((ly_ctx *)0x0,pdVar6->d_name + flen + 1), iVar3 != 0))
                   || ((_match_format[dir_len] == (DIR)0x40 &&
                       (iVar3 = strncmp((char *)(_match_format + dir_len + 1),
                                        pdVar6->d_name + flen + 1,10), -1 < iVar3))))
                goto LAB_0018c168;
                free(_match_format);
              }
              _match_format = dir;
              dir = (DIR *)0x0;
              dir_len = _implicit_cwd + 1 + flen;
              local_a0 = u;
            }
          }
        }
        goto LAB_0018c168;
      }
    }
  }
  *(DIR **)format_local = _match_format;
  _match_format = (DIR *)0x0;
  if (len != 0) {
    *(uint *)len = local_a0;
  }
  wd._4_4_ = 0;
LAB_0018c5c1:
  free(dir);
  free(wn);
  if (file != (dirent *)0x0) {
    closedir((DIR *)file);
  }
  free(_match_format);
  for (dirs._4_4_ = 0; dirs._4_4_ < *(uint *)(st.__glibc_reserved[2] + 4);
      dirs._4_4_ = dirs._4_4_ + 1) {
    free(*(void **)(*(long *)(st.__glibc_reserved[2] + 8) + (ulong)dirs._4_4_ * 8));
  }
  ly_set_free((ly_set *)st.__glibc_reserved[2]);
  return wd._4_4_;
}

Assistant:

API int
lys_search_localfile(const char * const *searchpaths, int cwd, const char *name, const char *revision, char **localfile, LYS_INFORMAT *format)
{
    size_t len, flen, match_len = 0, dir_len;
    int i, implicit_cwd = 0, ret = EXIT_FAILURE;
    char *wd, *wn = NULL;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL;
    LYS_INFORMAT format_aux, match_format = 0;
    unsigned int u;
    struct ly_set *dirs;
    struct stat st;

    if (!localfile) {
        LOGARG;
        return EXIT_FAILURE;
    }

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    dirs = ly_set_new();
    if (!dirs) {
        LOGMEM(NULL);
        return EXIT_FAILURE;
    }

    len = strlen(name);
    if (cwd) {
        wd = get_current_dir_name();
        if (!wd) {
            LOGMEM(NULL);
            goto cleanup;
        } else {
            /* add implicit current working directory (./) to be searched,
             * this directory is not searched recursively */
            if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
            implicit_cwd = 1;
        }
    }
    if (searchpaths) {
        for (i = 0; searchpaths[i]; i++) {
            /* check for duplicities with the implicit current working directory */
            if (implicit_cwd && !strcmp(dirs->set.g[0], searchpaths[i])) {
                implicit_cwd = 0;
                continue;
            }
            wd = strdup(searchpaths[i]);
            if (!wd) {
                LOGMEM(NULL);
                goto cleanup;
            } else if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->number) {
        free(wd);
        free(wn); wn = NULL;

        dirs->number--;
        wd = (char *)dirs->set.g[dirs->number];
        dirs->set.g[dirs->number] = NULL;
        LOGVRB("Searching for \"%s\" in %s.", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN(NULL, "Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
        } else {
            while ((file = readdir(dir))) {
                if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                    /* skip . and .. */
                    continue;
                }
                free(wn);
                if (asprintf(&wn, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM(NULL);
                    goto cleanup;
                }
                if (stat(wn, &st) == -1) {
                    LOGWRN(NULL, "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)",
                           file->d_name, wd, strerror(errno));
                    continue;
                }
                if (S_ISDIR(st.st_mode) && (dirs->number || !implicit_cwd)) {
                    /* we have another subdirectory in searchpath to explore,
                     * subdirectories are not taken into account in current working dir (dirs->set.g[0]) */
                    if (ly_set_add(dirs, wn, 0) == -1) {
                        goto cleanup;
                    }
                    /* continue with the next item in current directory */
                    wn = NULL;
                    continue;
                } else if (!S_ISREG(st.st_mode)) {
                    /* not a regular file (note that we see the target of symlinks instead of symlinks */
                    continue;
                }

                /* here we know that the item is a file which can contain a module */
                if (strncmp(name, file->d_name, len) ||
                        (file->d_name[len] != '.' && file->d_name[len] != '@')) {
                    /* different filename than the module we search for */
                    continue;
                }

                /* get type according to filename suffix */
                flen = strlen(file->d_name);
                if (!strcmp(&file->d_name[flen - 4], ".yin")) {
                    format_aux = LYS_IN_YIN;
                } else if (!strcmp(&file->d_name[flen - 5], ".yang")) {
                    format_aux = LYS_IN_YANG;
                } else {
                    /* not supportde suffix/file format */
                    continue;
                }

                if (revision) {
                    /* we look for the specific revision, try to get it from the filename */
                    if (file->d_name[len] == '@') {
                        /* check revision from the filename */
                        if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                            /* another revision */
                            continue;
                        } else {
                            /* exact revision */
                            free(match_name);
                            match_name = wn;
                            wn = NULL;
                            match_len = dir_len + 1 + len;
                            match_format = format_aux;
                            goto success;
                        }
                    } else {
                        /* continue trying to find exact revision match, use this only if not found */
                        free(match_name);
                        match_name = wn;
                        wn = NULL;
                        match_len = dir_len + 1 +len;
                        match_format = format_aux;
                        continue;
                    }
                } else {
                    /* remember the revision and try to find the newest one */
                    if (match_name) {
                        if (file->d_name[len] != '@' || lyp_check_date(NULL, &file->d_name[len + 1])) {
                            continue;
                        } else if (match_name[match_len] == '@' &&
                                (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                            continue;
                        }
                        free(match_name);
                    }

                    match_name = wn;
                    wn = NULL;
                    match_len = dir_len + 1 + len;
                    match_format = format_aux;
                    continue;
                }
            }
        }
    }

success:
    (*localfile) = match_name;
    match_name = NULL;
    if (format) {
        (*format) = match_format;
    }
    ret = EXIT_SUCCESS;

cleanup:
    free(wn);
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    for (u = 0; u < dirs->number; u++) {
        free(dirs->set.g[u]);
    }
    ly_set_free(dirs);

    return ret;
}